

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rectangle.hpp
# Opt level: O2

bool perior::operator==(rectangle<perior::point<double,_2UL>_> *lhs,
                       rectangle<perior::point<double,_2UL>_> *rhs)

{
  double dVar1;
  const_reference pdVar2;
  size_t i;
  size_type sVar3;
  bool bVar4;
  
  sVar3 = 0;
  do {
    if (sVar3 == 2) {
      sVar3 = 0;
      while( true ) {
        bVar4 = sVar3 == 2;
        if (bVar4) {
          return bVar4;
        }
        pdVar2 = boost::array<double,_2UL>::operator[](&(lhs->radius).values_,sVar3);
        dVar1 = *pdVar2;
        pdVar2 = boost::array<double,_2UL>::operator[](&(rhs->radius).values_,sVar3);
        sVar3 = sVar3 + 1;
        if (dVar1 != *pdVar2) break;
        if (NAN(dVar1) || NAN(*pdVar2)) {
          return bVar4;
        }
      }
      return bVar4;
    }
    pdVar2 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)lhs,sVar3);
    dVar1 = *pdVar2;
    pdVar2 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)rhs,sVar3);
    sVar3 = sVar3 + 1;
  } while ((dVar1 == *pdVar2) && (!NAN(dVar1) && !NAN(*pdVar2)));
  return false;
}

Assistant:

inline bool operator==(const rectangle<pointT>& lhs, const rectangle<pointT>& rhs)
    BOOST_NOEXCEPT_OR_NOTHROW
{
    return lhs.center == rhs.center && lhs.radius == rhs.radius;
}